

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O3

uint8_t number_of_children(sa_node N)

{
  return (N.first_A < N.first_C) +
         (N.first_G < N.first_T) + (N.first_T < N.last) + (N.first_C < N.first_G) +
         (N.first_TERM < N.first_A);
}

Assistant:

uint8_t number_of_children(sa_node N){

	return 	uint8_t(N.last>N.first_T) +
			uint8_t(N.first_T>N.first_G) +
			uint8_t(N.first_G>N.first_C) +
			uint8_t(N.first_C>N.first_A) +
			uint8_t(N.first_A>N.first_TERM);

}